

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_SetPrototypeInternal(JSContext *ctx,JSValue obj,JSValue proto_val,BOOL throw_flag)

{
  JSShape *pJVar1;
  int iVar2;
  JSValueUnion JVar3;
  JSValueUnion *pJVar4;
  JSValueUnion JVar5;
  JSValueUnion p;
  char *fmt;
  uint uVar6;
  uint uVar7;
  JSValueUnion JVar8;
  JSValue v;
  JSValue JVar9;
  JSValue method;
  JSValueUnion local_58;
  JSValueUnion JStack_50;
  JSValueUnion local_48;
  int64_t local_40;
  
  JVar5 = proto_val.u;
  p = obj.u;
  uVar6 = (uint)obj.tag;
  if (throw_flag == 0) {
    if (uVar6 != 0xffffffff) goto LAB_00118df3;
  }
  else if ((uVar6 & 0xfffffffe) == 2) goto LAB_00118df3;
  uVar7 = (uint)proto_val.tag;
  JVar8 = JVar5;
  if (uVar7 != 0xffffffff) {
    if (uVar7 != 2) {
LAB_00118df3:
      JS_ThrowTypeErrorNotAnObject(ctx);
      return -1;
    }
    JVar8.float64 = 0.0;
  }
  if (throw_flag != 0 && uVar6 != 0xffffffff) {
    return 1;
  }
  if (*(short *)((long)p.ptr + 6) == 0x29) {
    pJVar4 = (JSValueUnion *)get_proxy_method(ctx,&method,obj,0x60);
    if (pJVar4 == (JSValueUnion *)0x0) {
      return -1;
    }
    if ((int)method.tag == 3) {
      iVar2 = JS_SetPrototypeInternal(ctx,*(JSValue *)pJVar4,proto_val,throw_flag);
      return iVar2;
    }
    local_58 = *pJVar4;
    JStack_50 = pJVar4[1];
    JVar9.tag = method.tag;
    JVar9.u.float64 = method.u.float64;
    local_48 = JVar5;
    local_40 = proto_val.tag;
    JVar9 = JS_CallFree(ctx,JVar9,*(JSValue *)(pJVar4 + 2),2,(JSValue *)&local_58);
    if ((int)JVar9.tag == 6) {
      return -1;
    }
    iVar2 = JS_ToBoolFree(ctx,JVar9);
    if (iVar2 == 0) {
      if (throw_flag == 0) {
        return 0;
      }
      fmt = "proxy: bad prototype";
    }
    else {
      iVar2 = JS_IsExtensible(ctx,*(JSValue *)pJVar4);
      if (iVar2 < 0) {
        return -1;
      }
      if (iVar2 != 0) {
        return 1;
      }
      JVar9 = JS_GetPrototype(ctx,*(JSValue *)pJVar4);
      if ((int)JVar9.tag == 6) {
        return -1;
      }
      JS_FreeValue(ctx,JVar9);
      if (JVar9.u.ptr == JVar5.ptr) {
        return 1;
      }
      fmt = "proxy: inconsistent prototype";
    }
  }
  else {
    if ((*(JSShape **)((long)p.ptr + 0x18))->proto == (JSObject *)JVar8.ptr) {
      return 1;
    }
    if ((*(byte *)((long)p.ptr + 5) & 1) != 0) {
      JVar3 = JVar8;
      if ((JSObject *)JVar8.ptr != (JSObject *)0x0) {
        do {
          if (JVar3.ptr == p.ptr) {
            if (throw_flag == 0) {
              return 0;
            }
            fmt = "circular prototype chain";
            goto LAB_00118ebf;
          }
          JVar3 = (JSValueUnion)(*(JSShape **)((long)JVar3.ptr + 0x18))->proto;
        } while ((JSObject *)JVar3.ptr != (JSObject *)0x0);
        if (0xfffffff4 < uVar7) {
          *(int *)JVar5.ptr = *JVar5.ptr + 1;
        }
      }
      iVar2 = js_shape_prepare_update(ctx,(JSObject *)p.ptr,(JSShapeProperty **)0x0);
      if (iVar2 != 0) {
        return -1;
      }
      pJVar1 = *(JSShape **)((long)p.ptr + 0x18);
      JVar5 = (JSValueUnion)pJVar1->proto;
      if ((JSObject *)JVar5.ptr != (JSObject *)0x0) {
        v.tag = -1;
        v.u.ptr = JVar5.ptr;
        JS_FreeValue(ctx,v);
      }
      pJVar1->proto = (JSObject *)JVar8;
      return 1;
    }
    if (throw_flag == 0) {
      return 0;
    }
    fmt = "object is not extensible";
  }
LAB_00118ebf:
  JS_ThrowTypeError(ctx,fmt);
  return -1;
}

Assistant:

static int JS_SetPrototypeInternal(JSContext *ctx, JSValueConst obj,
                                   JSValueConst proto_val,
                                   BOOL throw_flag)
{
    JSObject *proto, *p, *p1;
    JSShape *sh;

    if (throw_flag) {
        if (JS_VALUE_GET_TAG(obj) == JS_TAG_NULL ||
            JS_VALUE_GET_TAG(obj) == JS_TAG_UNDEFINED)
            goto not_obj;
    } else {
        if (JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT)
            goto not_obj;
    }
    p = JS_VALUE_GET_OBJ(obj);
    if (JS_VALUE_GET_TAG(proto_val) != JS_TAG_OBJECT) {
        if (JS_VALUE_GET_TAG(proto_val) != JS_TAG_NULL) {
        not_obj:
            JS_ThrowTypeErrorNotAnObject(ctx);
            return -1;
        }
        proto = NULL;
    } else {
        proto = JS_VALUE_GET_OBJ(proto_val);
    }

    if (throw_flag && JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT)
        return TRUE;

    if (unlikely(p->class_id == JS_CLASS_PROXY))
        return js_proxy_setPrototypeOf(ctx, obj, proto_val, throw_flag);
    sh = p->shape;
    if (sh->proto == proto)
        return TRUE;
    if (!p->extensible) {
        if (throw_flag) {
            JS_ThrowTypeError(ctx, "object is not extensible");
            return -1;
        } else {
            return FALSE;
        }
    }
    if (proto) {
        /* check if there is a cycle */
        p1 = proto;
        do {
            if (p1 == p) {
                if (throw_flag) {
                    JS_ThrowTypeError(ctx, "circular prototype chain");
                    return -1;
                } else {
                    return FALSE;
                }
            }
            /* Note: for Proxy objects, proto is NULL */
            p1 = p1->shape->proto;
        } while (p1 != NULL);
        JS_DupValue(ctx, proto_val);
    }

    if (js_shape_prepare_update(ctx, p, NULL))
        return -1;
    sh = p->shape;
    if (sh->proto)
        JS_FreeValue(ctx, JS_MKPTR(JS_TAG_OBJECT, sh->proto));
    sh->proto = proto;
    return TRUE;
}